

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int64_t av1_interpolation_filter_search
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *tmp_dst,BUFFER_SET *orig_dst,int64_t *rd,int *switchable_rate,
                  int *skip_build_pred,HandleInterModeArgs *args,int64_t ref_best_rd)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BUFFER_SET dst;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  AV1_COMMON *cm_00;
  uint *switchable_ctx_00;
  long in_RSI;
  MACROBLOCK *in_RDI;
  TileDataEnc *in_R8;
  AV1_COMP *in_R9;
  long *in_stack_00000008;
  int *in_stack_00000010;
  undefined4 *in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  int mi_col;
  int mi_row;
  uint16_t allowed_interp_mask;
  BUFFER_SET *dst_bufs [2];
  int skip_ver;
  int skip_hor;
  int64_t mrd;
  int mode1;
  int mode0;
  MV_REFERENCE_FRAME *refs;
  int ref_mv_idx;
  int_interpfilters filters;
  int switchable_ctx [2];
  InterpFilter assign_filter;
  int match_found_idx;
  RD_STATS rd_stats;
  RD_STATS rd_stats_luma;
  int ref_frame;
  int need_search;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  InterpSearchFlags *interp_search_flags;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  RD_STATS *rd_stats_src;
  int in_stack_fffffffffffffe80;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffe84;
  AV1_COMP *in_stack_fffffffffffffe88;
  MB_MODE_INFO *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  BUFFER_SET *in_stack_fffffffffffffeb8;
  MACROBLOCK *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined2 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed6;
  BLOCK_SIZE in_stack_fffffffffffffed7;
  int *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  uint uVar19;
  MACROBLOCK *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  BLOCK_SIZE bsize_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar20;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined7 in_stack_ffffffffffffff28;
  BLOCK_SIZE in_stack_ffffffffffffff2f;
  TileDataEnc *in_stack_ffffffffffffff30;
  AV1_COMP *in_stack_ffffffffffffff38;
  MACROBLOCK *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  uint16_t in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  RD_STATS *in_stack_ffffffffffffff60;
  RD_STATS *in_stack_ffffffffffffff68;
  MB_MODE_INFO *mbmi_00;
  MACROBLOCKD *xd_00;
  int in_stack_ffffffffffffff88;
  
  cm_00 = (AV1_COMMON *)(in_RSI + 0x3bf80);
  switchable_ctx_00 = (uint *)(in_RSI + 0x9d2f0);
  iVar9 = av1_num_planes(cm_00);
  xd_00 = &in_RDI->e_mbd;
  mbmi_00 = *(in_RDI->e_mbd).mi;
  iVar10 = av1_is_interp_needed
                     ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  iVar11 = (int)(*xd_00->mi)->ref_frame[0];
  av1_init_rd_stats((RD_STATS *)&stack0xffffffffffffff48);
  av1_init_rd_stats((RD_STATS *)&stack0xffffffffffffff20);
  uVar20 = CONCAT13((cm_00->features).interp_filter,(int3)in_stack_ffffffffffffff18);
  iVar12 = find_interp_filter_match
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      (InterpFilter)((uint)in_stack_fffffffffffffe84 >> 0x18),
                      in_stack_fffffffffffffe80,
                      (INTERPOLATION_FILTER_STATS *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
  if (iVar12 == -1) {
    iVar13 = av1_get_pred_context_switchable_interp
                       ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                        ,in_stack_fffffffffffffe9c);
    iVar14 = av1_get_pred_context_switchable_interp
                       ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                        ,in_stack_fffffffffffffe9c);
    iVar15 = get_switchable_rate(in_RDI,mbmi_00->interp_filters,(int *)&stack0xffffffffffffff10,
                                 (uint)cm_00->seq_params->enable_dual_filter);
    *in_stack_00000010 = iVar15;
    uVar18 = *in_stack_00000018;
    rd_stats_src = (RD_STATS *)&stack0xffffffffffffff48;
    interp_model_rd_eval
              ((MACROBLOCK *)CONCAT44(iVar14,iVar13),
               (AV1_COMP *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
               (BUFFER_SET *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
               (RD_STATS *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    if (1 < iVar9) {
      uVar18 = *in_stack_00000018;
      rd_stats_src = (RD_STATS *)&stack0xffffffffffffff20;
      interp_model_rd_eval
                ((MACROBLOCK *)CONCAT44(iVar14,iVar13),
                 (AV1_COMP *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                 (BUFFER_SET *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                 (RD_STATS *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    }
    bsize_00 = (BLOCK_SIZE)((uint)iVar14 >> 0x18);
    *in_stack_00000018 = 1;
    av1_merge_rd_stats((RD_STATS *)CONCAT44(in_stack_fffffffffffffe84,uVar18),rd_stats_src);
    *in_stack_00000008 =
         ((long)(*in_stack_00000010 + in_stack_ffffffffffffff20) * (long)in_RDI->rdmult + 0x100 >> 9
         ) + CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28) * 0x80;
    in_RDI->pred_sse[iVar11] = (uint)((long)in_stack_ffffffffffffff60 >> 4);
    if (((char)((uint)uVar20 >> 0x18) == '\x04') && (iVar12 == -1)) {
      if (iVar10 == 0) {
        av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      }
      else {
        if ((*(long *)(in_stack_00000020 + 0x68) != 0) &&
           (iVar13 = has_second_ref(mbmi_00), iVar13 != 0)) {
          in_stack_ffffffffffffff08 = (uint)((byte)(*(ushort *)&mbmi_00->field_0xa7 >> 4) & 3);
          in_stack_ffffffffffffff00 = mbmi_00->ref_frame;
          bVar8 = compound_ref0_mode(mbmi_00->mode);
          uVar16 = (uint)bVar8;
          bVar8 = compound_ref1_mode(mbmi_00->mode);
          if (*(long *)(*(long *)(in_stack_00000020 + 0x68) + (long)(int)uVar16 * 0xc0 +
                        (long)(int)in_stack_ffffffffffffff08 * 0x40 +
                       (long)*in_stack_ffffffffffffff00 * 8) <
              *(long *)(*(long *)(in_stack_00000020 + 0x68) + (long)(int)(uint)bVar8 * 0xc0 +
                        (long)(int)in_stack_ffffffffffffff08 * 0x40 +
                       (long)in_stack_ffffffffffffff00[1] * 8)) {
            in_stack_fffffffffffffec0 =
                 *(MACROBLOCK **)
                  (*(long *)(in_stack_00000020 + 0x68) + (long)(int)uVar16 * 0xc0 +
                   (long)(int)in_stack_ffffffffffffff08 * 0x40 +
                  (long)*in_stack_ffffffffffffff00 * 8);
          }
          else {
            in_stack_fffffffffffffec0 =
                 *(MACROBLOCK **)
                  (*(long *)(in_stack_00000020 + 0x68) + (long)(int)(uint)bVar8 * 0xc0 +
                   (long)(int)in_stack_ffffffffffffff08 * 0x40 +
                  (long)in_stack_ffffffffffffff00[1] * 8);
          }
          in_stack_fffffffffffffef0 = in_stack_fffffffffffffec0;
          if (((long)in_stack_fffffffffffffec0 < *in_stack_00000008 >> 1) &&
             (in_stack_00000028 < 0x7fffffffffffffff)) {
            return 0x7fffffffffffffff;
          }
        }
        in_RDI->recalc_luma_mc_data = 0;
        uVar16 = *switchable_ctx_00;
        uVar17 = *switchable_ctx_00;
        calc_interp_skip_pred_flag
                  (in_stack_fffffffffffffef0,(AV1_COMP *)CONCAT44(uVar16,uVar17),
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        uVar1 = *(undefined8 *)(in_R8->tctx).txb_skip_cdf[0];
        uVar2 = (in_R8->tile_info).mi_col_end;
        uVar5 = (in_R8->tile_info).mi_row_start;
        uVar6 = (in_R8->tile_info).mi_row_end;
        uVar7 = (in_R8->tile_info).mi_col_start;
        dst.plane[1]._0_4_ = uVar7;
        dst.plane[0]._4_4_ = uVar6;
        dst.plane[0]._0_4_ = uVar5;
        uVar3 = (in_R8->tile_info).tile_row;
        uVar4 = (in_R8->tile_info).tile_col;
        dst.plane[2]._4_4_ = uVar4;
        dst.plane[2]._0_4_ = uVar3;
        dst.plane[1]._4_4_ = uVar2;
        dst.stride[0] = *(int *)&in_R8->field_0x18;
        dst.stride[1] = *(int *)&in_R8->field_0x1c;
        dst.stride[2] = (int)uVar1;
        dst._36_4_ = (int)((ulong)uVar1 >> 0x20);
        restore_dst_buf(xd_00,dst,iVar9);
        uVar19 = uVar17;
        if (cm_00->seq_params->enable_dual_filter == '\0') {
          find_best_non_dual_interp_filter
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2f,
                     (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (int64_t *)CONCAT44(iVar12,uVar20),(RD_STATS *)CONCAT44(iVar10,iVar11),
                     (RD_STATS *)mbmi_00,&xd_00->mi_row,
                     (BUFFER_SET **)CONCAT44(iVar9,in_stack_ffffffffffffff88),
                     (int *)switchable_ctx_00,(int)cm_00,(int)in_R9);
          iVar9 = (int)in_R9;
          uVar17 = uVar16;
        }
        else if (*(int *)(in_RSI + 0x60b40) == 0) {
          in_stack_fffffffffffffed6 = 0xff;
          in_stack_fffffffffffffed7 = BLOCK_4X8;
          reset_interp_filter_allowed_mask((uint16_t *)&stack0xfffffffffffffed6,'\0');
          uVar17 = (uint)CONCAT11(in_stack_fffffffffffffed7,in_stack_fffffffffffffed6);
          in_stack_fffffffffffffeb0 = 0;
          find_best_interp_rd_facade
                    ((MACROBLOCK *)CONCAT44(uVar16,uVar19),in_R9,in_R8,in_stack_fffffffffffffed7,
                     (BUFFER_SET *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (int64_t *)in_stack_fffffffffffffec0,
                     (RD_STATS *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (RD_STATS *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (int *)in_stack_ffffffffffffff30,(BUFFER_SET **)in_stack_ffffffffffffff38,
                     (int *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
          iVar9 = (int)in_R9;
        }
        else {
          fast_dual_interp_filter_rd
                    ((MACROBLOCK *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (TileDataEnc *)CONCAT44(iVar12,uVar20),bsize_00,
                     (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (int64_t *)in_stack_ffffffffffffff00,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff68,(int *)CONCAT44(iVar10,iVar11),(BUFFER_SET **)mbmi_00
                     ,&xd_00->mi_row,in_stack_ffffffffffffff88,(int)switchable_ctx_00);
          iVar9 = (int)in_R9;
        }
        swap_dst_buf((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (BUFFER_SET **)CONCAT44(in_stack_fffffffffffffeac,uVar17),
                     in_stack_fffffffffffffea4);
        if (in_RDI->recalc_luma_mc_data == 1) {
          av1_enc_build_inter_predictor
                    ((AV1_COMMON *)
                     CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,
                                       CONCAT24(in_stack_fffffffffffffed4,xd_00->mi_row))),
                     (MACROBLOCKD *)CONCAT44(xd_00->mi_col,in_stack_fffffffffffffec8),
                     (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,(BLOCK_SIZE)(in_stack_fffffffffffffeb4 >> 0x18),iVar9
                     ,uVar19);
        }
        in_RDI->pred_sse[iVar11] = (uint)((long)in_stack_ffffffffffffff60 >> 4);
        if (*(int *)(in_RSI + 0x60b48) != 0) {
          iVar9 = save_interp_filter_search_stat
                            ((MB_MODE_INFO *)in_stack_fffffffffffffec0,
                             (int64_t)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                             (INTERPOLATION_FILTER_STATS *)
                             CONCAT44(in_stack_fffffffffffffeac,uVar17),in_stack_fffffffffffffea4);
          *(int *)(in_stack_00000020 + 0x14a8) = iVar9;
        }
      }
    }
  }
  else {
    *in_stack_00000008 = *(long *)(in_stack_00000020 + (long)iVar12 * 0x28 + 0xa8);
    in_RDI->pred_sse[iVar11] = *(uint *)(in_stack_00000020 + (long)iVar12 * 0x28 + 0xb0);
    *in_stack_00000018 = 0;
  }
  return 0;
}

Assistant:

int64_t av1_interpolation_filter_search(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const tmp_dst, const BUFFER_SET *const orig_dst,
    int64_t *const rd, int *const switchable_rate, int *skip_build_pred,
    HandleInterModeArgs *args, int64_t ref_best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int need_search = av1_is_interp_needed(xd);
  const int ref_frame = xd->mi[0]->ref_frame[0];
  RD_STATS rd_stats_luma, rd_stats;

  // Initialization of rd_stats structures with default values
  av1_init_rd_stats(&rd_stats_luma);
  av1_init_rd_stats(&rd_stats);

  int match_found_idx = -1;
  const InterpFilter assign_filter = cm->features.interp_filter;

  match_found_idx = find_interp_filter_match(
      mbmi, cpi, assign_filter, need_search, args->interp_filter_stats,
      args->interp_filter_stats_idx);

  if (match_found_idx != -1) {
    *rd = args->interp_filter_stats[match_found_idx].rd;
    x->pred_sse[ref_frame] =
        args->interp_filter_stats[match_found_idx].pred_sse;
    *skip_build_pred = 0;
    return 0;
  }

  int switchable_ctx[2];
  switchable_ctx[0] = av1_get_pred_context_switchable_interp(xd, 0);
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(xd, 1);
  *switchable_rate =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  // Do MC evaluation for default filter_type.
  // Luma MC
  interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                       &rd_stats_luma, *skip_build_pred);

#if CONFIG_COLLECT_RD_STATS == 3
  RD_STATS rd_stats_y;
  av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize, INT64_MAX);
  PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
  // Chroma MC
  if (num_planes > 1) {
    interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_U, AOM_PLANE_V,
                         &rd_stats, *skip_build_pred);
  }
  *skip_build_pred = 1;

  av1_merge_rd_stats(&rd_stats, &rd_stats_luma);

  assert(rd_stats.rate >= 0);

  *rd = RDCOST(x->rdmult, *switchable_rate + rd_stats.rate, rd_stats.dist);
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  if (assign_filter != SWITCHABLE || match_found_idx != -1) {
    return 0;
  }
  if (!need_search) {
    int_interpfilters filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    assert(mbmi->interp_filters.as_int == filters.as_int);
    (void)filters;
    return 0;
  }
  if (args->modelled_rd != NULL) {
    if (has_second_ref(mbmi)) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      MV_REFERENCE_FRAME *refs = mbmi->ref_frame;
      const int mode0 = compound_ref0_mode(mbmi->mode);
      const int mode1 = compound_ref1_mode(mbmi->mode);
      const int64_t mrd = AOMMIN(args->modelled_rd[mode0][ref_mv_idx][refs[0]],
                                 args->modelled_rd[mode1][ref_mv_idx][refs[1]]);
      if ((*rd >> 1) > mrd && ref_best_rd < INT64_MAX) {
        return INT64_MAX;
      }
    }
  }

  x->recalc_luma_mc_data = 0;
  // skip_flag=xx (in binary form)
  // Setting 0th flag corresonds to skipping luma MC and setting 1st bt
  // corresponds to skipping chroma MC  skip_flag=0 corresponds to "Don't skip
  // luma and chroma MC"  Skip flag=1 corresponds to "Skip Luma MC only"
  // Skip_flag=2 is not a valid case
  // skip_flag=3 corresponds to "Skip both luma and chroma MC"
  int skip_hor = interp_search_flags->default_interp_skip_flags;
  int skip_ver = interp_search_flags->default_interp_skip_flags;
  calc_interp_skip_pred_flag(x, cpi, &skip_hor, &skip_ver);

  // do interp_filter search
  restore_dst_buf(xd, *tmp_dst, num_planes);
  const BUFFER_SET *dst_bufs[2] = { tmp_dst, orig_dst };
  // Evaluate dual interp filters
  if (cm->seq_params->enable_dual_filter) {
    if (cpi->sf.interp_sf.use_fast_interpolation_filter_search) {
      fast_dual_interp_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx, skip_hor, skip_ver);
    } else {
      // Use full interpolation filter search
      uint16_t allowed_interp_mask = ALLOW_ALL_INTERP_FILT_MASK;
      // REG_REG filter type is evaluated beforehand, so loop is repeated over
      // REG_SMOOTH to SHARP_SHARP for full interpolation filter search
      reset_interp_filter_allowed_mask(&allowed_interp_mask, REG_REG);
      find_best_interp_rd_facade(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx,
                                 (skip_hor & skip_ver), allowed_interp_mask, 0);
    }
  } else {
    // Evaluate non-dual interp filters
    find_best_non_dual_interp_filter(
        x, cpi, tile_data, bsize, orig_dst, rd, &rd_stats_luma, &rd_stats,
        switchable_rate, dst_bufs, switchable_ctx, skip_ver, skip_hor);
  }
  swap_dst_buf(xd, dst_bufs, num_planes);
  // Recompute final MC data if required
  if (x->recalc_luma_mc_data == 1) {
    // Recomputing final luma MC data is required only if the same was skipped
    // in either of the directions  Condition below is necessary, but not
    // sufficient
    assert((skip_hor == 1) || (skip_ver == 1));
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  // save search results
  if (cpi->sf.interp_sf.use_interp_filter) {
    assert(match_found_idx == -1);
    args->interp_filter_stats_idx = save_interp_filter_search_stat(
        mbmi, *rd, x->pred_sse[ref_frame], args->interp_filter_stats,
        args->interp_filter_stats_idx);
  }
  return 0;
}